

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O3

void crnlib::vector<Node>::object_mover(void *pDst_void,void *pSrc_void,uint num)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  long lVar3;
  Node *pSrc;
  
  if (num != 0) {
    lVar3 = 0;
    do {
      puVar1 = (undefined8 *)((long)pSrc_void + lVar3);
      uVar2 = puVar1[1];
      *(undefined8 *)((long)pDst_void + lVar3) = *puVar1;
      ((undefined8 *)((long)pDst_void + lVar3))[1] = uVar2;
      *(undefined1 *)((long)pDst_void + lVar3 + 0x10) = *(undefined1 *)(puVar1 + 2);
      *(undefined1 *)((long)pDst_void + lVar3 + 0x11) = *(undefined1 *)((long)puVar1 + 0x11);
      *(undefined1 *)((long)pDst_void + lVar3 + 0x12) = *(undefined1 *)((long)puVar1 + 0x12);
      *(undefined1 *)((long)pDst_void + lVar3 + 0x13) = *(undefined1 *)((long)puVar1 + 0x13);
      *(undefined1 *)((long)pDst_void + lVar3 + 0x14) = *(undefined1 *)((long)puVar1 + 0x14);
      *(undefined1 *)((long)pDst_void + lVar3 + 0x15) = *(undefined1 *)((long)puVar1 + 0x15);
      *(undefined1 *)((long)pDst_void + lVar3 + 0x16) = *(undefined1 *)((long)puVar1 + 0x16);
      *(undefined1 *)((long)pDst_void + lVar3 + 0x17) = *(undefined1 *)((long)puVar1 + 0x17);
      lVar3 = lVar3 + 0x18;
    } while (puVar1 + 3 != (undefined8 *)((long)pSrc_void + (ulong)num * 0x18));
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num)
        {
            T* pSrc = static_cast<T*>(pSrc_void);
            T* const pSrc_end = pSrc + num;
            T* pDst = static_cast<T*>(pDst_void);

            while (pSrc != pSrc_end)
            {
                // placement new
                new (static_cast<void*>(pDst)) T(*pSrc);
                pSrc->~T();
                ++pSrc;
                ++pDst;
            }
        }